

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyStrToReal(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  byte bVar1;
  ushort *puVar2;
  sxreal *in_RAX;
  ushort **ppuVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  byte *pbVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  byte *pbVar17;
  bool bVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  pbVar17 = (byte *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar3 = __ctype_b_loc();
    in_RAX = (sxreal *)*ppuVar3;
    do {
      bVar1 = *zSrc;
      if ((*(byte *)((long)in_RAX + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) {
        in_RAX = (sxreal *)(ulong)bVar1;
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          bVar18 = bVar1 == 0x2d;
          zSrc = (char *)((byte *)zSrc + 1);
          goto LAB_0011ad3a;
        }
        break;
      }
      zSrc = (char *)((byte *)zSrc + 1);
    } while (zSrc < pbVar17);
  }
  bVar18 = false;
LAB_0011ad3a:
  pbVar13 = (byte *)zSrc;
  if (zSrc < pbVar17) {
    ppuVar3 = __ctype_b_loc();
    puVar2 = *ppuVar3;
    dVar21 = 0.0;
    iVar14 = 0xf;
    in_RAX = (double *)0x0;
    while( true ) {
      if ((*(byte *)((long)puVar2 + (long)(char)((byte *)zSrc)[(long)in_RAX] * 2 + 1) & 8) == 0) {
        pbVar13 = (byte *)zSrc + (long)in_RAX;
        goto LAB_0011ae66;
      }
      dVar21 = dVar21 * 10.0 + (double)((char)((byte *)zSrc)[(long)in_RAX] + -0x30);
      pbVar8 = (byte *)zSrc + (long)in_RAX + 1;
      iVar15 = (int)in_RAX;
      if ((pbVar17 <= pbVar8) || ((*(byte *)((long)puVar2 + (long)(char)*pbVar8 * 2 + 1) & 8) == 0))
      break;
      dVar21 = dVar21 * 10.0 + (double)((char)*pbVar8 + -0x30);
      pbVar8 = (byte *)zSrc + (long)in_RAX + 2;
      if ((pbVar17 <= pbVar8) || ((*(byte *)((long)puVar2 + (long)(char)*pbVar8 * 2 + 1) & 8) == 0))
      {
        iVar14 = 0xd;
        goto LAB_0011ae56;
      }
      dVar21 = dVar21 * 10.0 + (double)((char)*pbVar8 + -0x30);
      if (((pbVar17 <= (byte *)zSrc + (long)in_RAX + 3) || (iVar15 == 0xc)) ||
         (bVar1 = ((byte *)zSrc + (long)in_RAX)[3],
         (*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) == 0)) {
        iVar14 = iVar14 + -3;
        pbVar13 = pbVar13 + 3;
        goto LAB_0011ae66;
      }
      dVar21 = dVar21 * 10.0 + (double)((char)bVar1 + -0x30);
      pbVar13 = pbVar13 + 4;
      iVar14 = iVar14 + -4;
      if ((pbVar17 <= (byte *)((long)in_RAX + (long)zSrc) + 4) ||
         (in_RAX = (sxreal *)((long)in_RAX + 4), iVar15 == 0xb)) goto LAB_0011ae66;
    }
    iVar14 = 0xe;
LAB_0011ae56:
    iVar14 = iVar14 - iVar15;
    pbVar13 = pbVar8;
  }
  else {
    iVar14 = 0xf;
    dVar21 = 0.0;
  }
LAB_0011ae66:
  if ((pbVar13 < pbVar17) && (in_RAX = (sxreal *)(ulong)(*pbVar13 | 2), (*pbVar13 | 2) == 0x2e)) {
    pbVar16 = pbVar13 + 1;
    dVar20 = 1.0;
    pbVar8 = pbVar16;
    if ((pbVar16 < pbVar17) && (iVar14 != 0)) {
      ppuVar3 = __ctype_b_loc();
      in_RAX = (sxreal *)*ppuVar3;
      iVar7 = iVar14 + -1;
      iVar9 = iVar14 + -2;
      iVar10 = iVar14 + -3;
      iVar4 = iVar14 + -4;
      dVar20 = 1.0;
      lVar12 = 0;
      iVar15 = iVar14;
      while ((*(byte *)((long)in_RAX + (long)(char)pbVar13[lVar12 + 1] * 2 + 1) & 8) != 0) {
        dVar21 = dVar21 * 10.0 + (double)((char)pbVar13[lVar12 + 1] + -0x30);
        dVar20 = dVar20 * 10.0;
        pbVar8 = pbVar16 + 1;
        iVar14 = iVar15 + -1;
        if (((pbVar17 <= pbVar13 + lVar12 + 2) || (iVar11 = (int)lVar12, iVar7 == iVar11)) ||
           (bVar1 = pbVar13[lVar12 + 2],
           (*(byte *)((long)in_RAX + (long)(char)bVar1 * 2 + 1) & 8) == 0)) goto LAB_0011affc;
        dVar21 = dVar21 * 10.0 + (double)((char)bVar1 + -0x30);
        dVar20 = dVar20 * 10.0;
        pbVar8 = pbVar16 + 2;
        iVar14 = iVar15 + -2;
        if (((pbVar17 <= pbVar13 + lVar12 + 3) || (iVar9 == iVar11)) ||
           (bVar1 = pbVar13[lVar12 + 3],
           (*(byte *)((long)in_RAX + (long)(char)bVar1 * 2 + 1) & 8) == 0)) goto LAB_0011affc;
        dVar21 = dVar21 * 10.0 + (double)((char)bVar1 + -0x30);
        dVar20 = dVar20 * 10.0;
        pbVar8 = pbVar16 + 3;
        iVar14 = iVar15 + -3;
        if (((pbVar17 <= pbVar13 + lVar12 + 4) || (iVar10 == iVar11)) ||
           (bVar1 = pbVar13[lVar12 + 4],
           (*(byte *)((long)in_RAX + (long)(char)bVar1 * 2 + 1) & 8) == 0)) goto LAB_0011affc;
        dVar21 = dVar21 * 10.0 + (double)((char)bVar1 + -0x30);
        dVar20 = dVar20 * 10.0;
        pbVar16 = pbVar16 + 4;
        iVar14 = iVar15 + -4;
        pbVar8 = pbVar16;
        if ((pbVar17 <= pbVar13 + lVar12 + 5) ||
           (lVar12 = lVar12 + 4, iVar15 = iVar14, iVar4 == iVar11)) goto LAB_0011affc;
      }
      pbVar8 = pbVar13 + lVar12 + 1;
      iVar14 = iVar15;
    }
LAB_0011affc:
    pbVar13 = pbVar8;
    dVar21 = dVar21 / dVar20;
  }
  if (bVar18) {
    uVar19 = -(ulong)(dVar21 != -dVar21);
    dVar21 = (double)(~uVar19 & (ulong)dVar21 | (ulong)-dVar21 & uVar19);
  }
  if (iVar14 < 1) {
    for (; (pbVar13 < pbVar17 &&
           (in_RAX = (sxreal *)(ulong)(*pbVar13 | 0x20), (*pbVar13 | 0x20) != 0x65));
        pbVar13 = pbVar13 + 1) {
    }
  }
  if ((pbVar13 < pbVar17) &&
     (in_RAX = (sxreal *)(ulong)(*pbVar13 | 0x20), (*pbVar13 | 0x20) == 0x65)) {
    pbVar8 = pbVar13 + 1;
    bVar18 = true;
    if ((pbVar8 < pbVar17) && ((bVar1 = *pbVar8, bVar1 == 0x2d || (bVar1 == 0x2b)))) {
      bVar18 = bVar1 != 0x2d;
      pbVar8 = pbVar13 + 2;
    }
    pbVar13 = pbVar8;
    in_RAX = (double *)0x0;
    if (pbVar13 < pbVar17) {
      ppuVar3 = __ctype_b_loc();
      in_RAX = (double *)0x0;
      do {
        if (((*(byte *)((long)*ppuVar3 + (long)(char)*pbVar13 * 2 + 1) & 8) == 0) ||
           (0x133 < (int)in_RAX)) break;
        in_RAX = (sxreal *)(ulong)(((int)(char)*pbVar13 + (int)in_RAX * 10) - 0x30);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 < pbVar17);
    }
    if (bVar18) {
      uVar5 = 0x134;
    }
    else {
      uVar5 = 0x133;
    }
    pdVar6 = (double *)(ulong)uVar5;
    if ((int)in_RAX < (int)uVar5) {
      pdVar6 = in_RAX;
    }
    if ((int)pdVar6 != 0) {
      in_RAX = SyStrToReal::aTab;
      do {
        if (((ulong)pdVar6 & 1) != 0) {
          if (bVar18) {
            dVar21 = dVar21 * *in_RAX;
          }
          else {
            dVar21 = dVar21 / *in_RAX;
          }
        }
        uVar5 = (uint)pdVar6;
        in_RAX = in_RAX + 1;
        pdVar6 = (double *)(ulong)(uint)((int)uVar5 >> 1);
      } while (1 < uVar5);
    }
  }
  if (pbVar13 < pbVar17) {
    ppuVar3 = __ctype_b_loc();
    in_RAX = (sxreal *)*ppuVar3;
    bVar1 = *(byte *)((long)in_RAX + (long)(char)*pbVar13 * 2 + 1);
    while (((bVar1 & 0x20) != 0 && (pbVar13 = pbVar13 + 1, pbVar13 < pbVar17))) {
      bVar1 = *(byte *)((long)in_RAX + (long)(char)*pbVar13 * 2 + 1);
    }
  }
  if (pOutVal != (void *)0x0) {
    *(double *)pOutVal = dVar21;
  }
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToReal(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
#define SXDBL_DIG        15
#define SXDBL_MAX_EXP    308
#define SXDBL_MIN_EXP_PLUS	307
	static const sxreal aTab[] = {
	10, 
	1.0e2, 
	1.0e4, 
	1.0e8, 
	1.0e16, 
	1.0e32, 
	1.0e64, 
	1.0e128, 
	1.0e256
	};
	sxu8 neg = FALSE;
	sxreal Val = 0.0;
	const char *zEnd;
	sxi32 Lim, exp;
	sxreal *p = 0;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc)  ){
		if( pOutVal ){
			*(sxreal *)pOutVal = 0.0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++; 
	}
	if( zSrc < zEnd && (zSrc[0] == '-' || zSrc[0] == '+' ) ){
		neg =  zSrc[0] == '-' ? TRUE : FALSE ;
		zSrc++;
	}
	Lim = SXDBL_DIG ;
	for(;;){
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
	}
	if( zSrc < zEnd && ( zSrc[0] == '.' || zSrc[0] == ',' ) ){
		sxreal dec = 1.0;
		zSrc++;
		for(;;){
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
		}
		Val /= dec;
	}
	if( neg == TRUE && Val != 0.0 ) {
		Val = -Val ; 
	}
	if( Lim <= 0 ){
		/* jump overflow digit */
		while( zSrc < zEnd ){
			if( zSrc[0] == 'e' || zSrc[0] == 'E' ){
				break;  
			}
			zSrc++;
		}
	}
	neg = FALSE;
	if( zSrc < zEnd && ( zSrc[0] == 'e' || zSrc[0] == 'E' ) ){
		zSrc++;
		if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+') ){
			neg = zSrc[0] == '-' ? TRUE : FALSE ;
			zSrc++;
		}
		exp = 0;
		while( zSrc < zEnd && SyisDigit(zSrc[0]) && exp < SXDBL_MAX_EXP ){
			exp = exp * 10 + (zSrc[0] - '0');
			zSrc++;
		}
		if( neg  ){
			if( exp > SXDBL_MIN_EXP_PLUS ) exp = SXDBL_MIN_EXP_PLUS ;
		}else if ( exp > SXDBL_MAX_EXP ){
			exp = SXDBL_MAX_EXP; 
		}		
		for( p = (sxreal *)aTab ; exp ; exp >>= 1 , p++ ){
			if( exp & 01 ){
				if( neg ){
					Val /= *p ;
				}else{
					Val *= *p;
				}
			}
		}
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc; 
	}
	if( pOutVal ){
		*(sxreal *)pOutVal = Val;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}